

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::LookupNearest(Image *this,Point2f p,ImageChannelDesc *desc,WrapMode2D wrapMode)

{
  Image *pIVar1;
  Image *this_00;
  WrapMode aWVar2 [2];
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_RDX;
  Tuple2<pbrt::Point2,_float> in_RSI;
  array<pbrt::WrapMode,_2> in_RDI;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  int i;
  ImageChannelValues *cv;
  size_type in_stack_ffffffffffffff68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  ImageChannelValues *in_stack_ffffffffffffff90;
  int local_30;
  
  FVar3 = (Float)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  vmovlpd_avx(in_ZMM0._0_16_);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(in_RDX);
  ImageChannelValues::ImageChannelValues(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,FVar3);
  local_30 = 0;
  while( true ) {
    pIVar1 = (Image *)(long)local_30;
    this_00 = (Image *)InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(in_RDX);
    if (this_00 <= pIVar1) break;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    FVar3 = LookupNearestChannel
                      (this_00,(Point2f)in_RSI,(int)((ulong)pIVar1 >> 0x20),
                       (WrapMode2D)in_RDI.values);
    in_stack_ffffffffffffff70 =
         (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
         InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    *(Float *)&((polymorphic_allocator<int> *)&in_stack_ffffffffffffff70->alloc)->memoryResource =
         FVar3;
    local_30 = local_30 + 1;
  }
  aWVar2[0] = in_RDI.values[0];
  aWVar2[1] = in_RDI.values[1];
  return (ImageChannelValues *)aWVar2;
}

Assistant:

ImageChannelValues Image::LookupNearest(Point2f p, const ImageChannelDesc &desc,
                                        WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    for (int i = 0; i < desc.offset.size(); ++i)
        cv[i] = LookupNearestChannel(p, desc.offset[i], wrapMode);
    return cv;
}